

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O1

void glob_initfromgui(void *dummy,t_symbol *s,int argc,t_atom *argv)

{
  char *pcVar1;
  t_namelist *ptVar2;
  char *name;
  bool bVar3;
  int iVar4;
  t_symbol *ptVar5;
  long lVar6;
  t_symbol *dir;
  _binbuf *x;
  size_t size;
  _namelist *p_Var7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  t_float tVar14;
  t_float tVar15;
  char *nameptr;
  char dirbuf [1000];
  char *local_420;
  char local_418 [1000];
  
  ptVar5 = atom_getsymbolarg(0,argc,argv);
  pcVar1 = ptVar5->s_name;
  tVar14 = atom_getfloatarg(1,argc,argv);
  sys_oldtclversion = (int)tVar14;
  if (argc != 0x26) {
    bug("glob_initfromgui");
  }
  lVar9 = 0x1e5128;
  iVar4 = 0;
  bVar3 = false;
  lVar6 = 0;
  do {
    lVar10 = 0;
    do {
      iVar11 = (int)lVar10;
      tVar14 = atom_getfloatarg(iVar4 + iVar11 + 2,argc,argv);
      iVar12 = (int)tVar14;
      tVar14 = atom_getfloatarg(iVar4 + iVar11 + 3,argc,argv);
      tVar15 = atom_getfloatarg(iVar4 + iVar11 + 4,argc,argv);
      if (((iVar12 == 0) || (iVar11 = (int)tVar14, iVar11 == 0)) ||
         (iVar8 = (int)tVar15, iVar8 == 0)) {
        iVar8 = (int)(lVar6 + 1);
        iVar12 = (&sys_fontspec[0].fi_pointsize)[lVar10] * iVar8;
        iVar11 = (&sys_fontspec[0].fi_width)[lVar10] * iVar8;
        iVar8 = (&sys_fontspec[0].fi_height)[lVar10] * iVar8;
        if (!bVar3) {
          logpost((void *)0x0,4,"ignoring invalid font-metrics from GUI");
        }
        bVar3 = true;
      }
      *(int *)(lVar9 + -8 + lVar10 * 4) = iVar12;
      *(int *)(lVar9 + -4 + lVar10 * 4) = iVar11;
      *(int *)(lVar9 + lVar10 * 4) = iVar8;
      lVar10 = lVar10 + 3;
    } while (lVar10 != 0x12);
    lVar9 = lVar9 + 0x48;
    iVar4 = iVar4 + 0x12;
    bVar13 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar13);
  iVar4 = sys_oktoloadfiles(0);
  if (iVar4 != 0) {
    for (ptVar2 = (pd_maininstance.pd_stuff)->st_externlist; ptVar2 != (t_namelist *)0x0;
        ptVar2 = ptVar2->nl_next) {
      iVar4 = sys_load_lib((_glist *)0x0,ptVar2->nl_string);
      if (iVar4 == 0) {
        post("%s: can\'t load library",ptVar2->nl_string);
      }
    }
    sys_oktoloadfiles(1);
  }
  if (sys_openlist != (t_namelist *)0x0) {
    p_Var7 = sys_openlist;
    do {
      name = p_Var7->nl_string;
      iVar4 = open_via_path(pcVar1,name,"",local_418,&local_420,1000,0);
      if (iVar4 < 0) {
        pd_error((void *)0x0,"%s: can\'t open",name);
      }
      else {
        close(iVar4);
        ptVar5 = gensym(local_420);
        dir = gensym(local_418);
        glob_evalfile((t_pd *)0x0,ptVar5,dir);
      }
      p_Var7 = p_Var7->nl_next;
    } while (p_Var7 != (_namelist *)0x0);
  }
  namelist_free(sys_openlist);
  sys_openlist = (t_namelist *)0x0;
  for (p_Var7 = sys_messagelist; p_Var7 != (t_namelist *)0x0; p_Var7 = p_Var7->nl_next) {
    x = binbuf_new();
    pcVar1 = p_Var7->nl_string;
    size = strlen(pcVar1);
    binbuf_text(x,pcVar1,size);
    binbuf_eval(x,(t_pd *)0x0,0,(t_atom *)0x0);
    binbuf_free(x);
  }
  namelist_free(sys_messagelist);
  sys_messagelist = (t_namelist *)0x0;
  return;
}

Assistant:

void glob_initfromgui(void *dummy, t_symbol *s, int argc, t_atom *argv)
{
    const char *cwd = atom_getsymbolarg(0, argc, argv)->s_name;
    t_namelist *nl;
    unsigned int i;
    int did_fontwarning = 0;
    int j;
    sys_oldtclversion = atom_getfloatarg(1, argc, argv);
    if (argc != 2 + 3 * NZOOM * NFONT)
        bug("glob_initfromgui");
    for (j = 0; j < NZOOM; j++)
        for (i = 0; i < NFONT; i++)
    {
        int size   = atom_getfloatarg(3 * (i + j * NFONT) + 2, argc, argv);
        int width  = atom_getfloatarg(3 * (i + j * NFONT) + 3, argc, argv);
        int height = atom_getfloatarg(3 * (i + j * NFONT) + 4, argc, argv);
        if (!(size && width && height))
        {
            size   = (j+1)*sys_fontspec[i].fi_pointsize;
            width  = (j+1)*sys_fontspec[i].fi_width;
            height = (j+1)*sys_fontspec[i].fi_height;
            if (!did_fontwarning)
            {
                logpost(NULL, PD_VERBOSE, "ignoring invalid font-metrics from GUI");
                did_fontwarning = 1;
            }
        }
        sys_gotfonts[j][i].fi_pointsize = size;
        sys_gotfonts[j][i].fi_width = width;
        sys_gotfonts[j][i].fi_height = height;
#if 0
            fprintf(stderr, "font (%d %d %d)\n",
                sys_gotfonts[j][i].fi_pointsize, sys_gotfonts[j][i].fi_width,
                    sys_gotfonts[j][i].fi_height);
#endif
    }
        /* load dynamic libraries specified with "-lib" args */
    if (sys_oktoloadfiles(0))
    {
        for  (nl = STUFF->st_externlist; nl; nl = nl->nl_next)
            if (!sys_load_lib(0, nl->nl_string))
                post("%s: can't load library", nl->nl_string);
        sys_oktoloadfiles(1);
    }
        /* open patches specifies with "-open" args */
    for  (nl = sys_openlist; nl; nl = nl->nl_next)
        openit(cwd, nl->nl_string);
    namelist_free(sys_openlist);
    sys_openlist = 0;
        /* send messages specified with "-send" args */
    for  (nl = sys_messagelist; nl; nl = nl->nl_next)
    {
        t_binbuf *b = binbuf_new();
        binbuf_text(b, nl->nl_string, strlen(nl->nl_string));
        binbuf_eval(b, 0, 0, 0);
        binbuf_free(b);
    }
    namelist_free(sys_messagelist);
    sys_messagelist = 0;
}